

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O2

bool __thiscall
QEventDispatcherUNIX::processEvents(QEventDispatcherUNIX *this,ProcessEventsFlags flags)

{
  QList<pollfd> *this_00;
  Entry *pEVar1;
  undefined4 uVar2;
  QEventDispatcherUNIXPrivate *this_01;
  QThreadData *data;
  Data *pDVar3;
  Span *pSVar4;
  bool bVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  duration<long,_std::ratio<1L,_1000000000L>_> *pdVar9;
  pointer fds;
  value_type vVar10;
  qsizetype asize;
  undefined8 uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QDeadlineTimer deadline;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar14;
  QDeadlineTimer local_58;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QEventDispatcherUNIXPrivate **)(this + 8);
  (this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QAbstractEventDispatcher::awake((QAbstractEventDispatcher *)this);
  data = (this_01->super_QAbstractEventDispatcherPrivate).super_QObjectPrivate.threadData.
         super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p;
  QCoreApplicationPrivate::sendPostedEvents((QObject *)0x0,0,data);
  bVar5 = QThreadData::canWaitLocked(data);
  if (bVar5) {
    bVar5 = ((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                   super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 4) != 0;
    bVar13 = (this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0;
    if (bVar13 && bVar5) {
      QAbstractEventDispatcher::aboutToBlock((QAbstractEventDispatcher *)this);
    }
    if ((this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i != 0) {
      uVar12 = 0;
      goto LAB_0037d81d;
    }
    uVar12 = 0;
    if (bVar13 && bVar5) {
      uVar12 = 0x7fffffffffffffff;
    }
    uVar11._0_4_ = 0;
    uVar11._4_4_ = 1;
    if ((char)(((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                      super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) >> 3) == '\0' &&
        (bVar13 && bVar5)) {
      local_48.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      oVar14 = QTimerInfoList::timerWait(&this_01->timerList);
      local_48._0_9_ =
           oVar14.
           super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           _0_9_;
      if (((undefined1  [16])
           oVar14.
           super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_58.t1 = 0x7fffffffffffffff;
        local_58.t2 = 0;
        local_58.type = 1;
        uVar11 = local_58._8_8_;
        uVar12 = local_58.t1;
      }
      else {
        pdVar9 = std::
                 _Optional_base_impl<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::_Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>_>
                 ::_M_get((_Optional_base_impl<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::_Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>_>
                           *)&local_48);
        QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000000000l>>
                  (&local_58,(duration<long,_std::ratio<1L,_1000000000L>_>)pdVar9->__r,CoarseTimer);
        uVar11 = local_58._8_8_;
        uVar12 = local_58.t1;
      }
    }
  }
  else {
    uVar12 = 0;
    if ((this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i != 0) goto LAB_0037d81d;
    uVar11._0_4_ = 0;
    uVar11._4_4_ = 1;
  }
  this_00 = &this_01->pollfds;
  QList<pollfd>::clear(this_00);
  if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
             super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 2) == 0) {
    pDVar3 = (this_01->socketNotifiers).d;
    if (pDVar3 == (Data *)0x0) {
      asize = 1;
    }
    else {
      asize = pDVar3->size + 1;
    }
    QList<pollfd>::reserve(this_00,asize);
    local_48 = (piter)QHash<int,_QSocketNotifierSetUNIX>::cbegin(&this_01->socketNotifiers);
    while( true ) {
      if (local_48.d == (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)0x0 &&
          local_48.bucket == 0) break;
      pSVar4 = (local_48.d)->spans;
      pEVar1 = pSVar4[local_48.bucket >> 7].entries +
               pSVar4[local_48.bucket >> 7].offsets[(uint)local_48.bucket & 0x7f];
      uVar2 = *(undefined4 *)(pEVar1->storage).data;
      sVar6 = QSocketNotifierSetUNIX::events((QSocketNotifierSetUNIX *)((pEVar1->storage).data + 8))
      ;
      local_58.t1 = (qint64)CONCAT24(sVar6,uVar2);
      QList<pollfd>::emplaceBack<pollfd>(this_00,(pollfd *)&local_58);
      QHashPrivate::iterator<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::operator++
                (&local_48);
    }
  }
  else {
    QList<pollfd>::reserve(this_00,1);
  }
  local_48.d = (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)
               ((ulong)*(uint *)&(this_01->super_QAbstractEventDispatcherPrivate).field_0x94 |
               0x100000000);
  QList<pollfd>::emplaceBack<pollfd>(this_00,(pollfd *)&local_48);
  fds = QList<pollfd>::data(this_00);
  deadline.t2 = (uint)uVar11;
  deadline.type = SUB84(uVar11,4);
  deadline.t1 = uVar12;
  iVar7 = qt_safe_poll(fds,(this_01->pollfds).d.size,deadline);
  if (iVar7 != 0) {
    if (iVar7 == -1) {
      iVar7 = 0;
      qErrnoWarning("qt_safe_poll");
    }
    else {
      vVar10 = QList<pollfd>::takeLast(this_00);
      local_48.d = (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)vVar10;
      iVar7 = QThreadPipe::check((QThreadPipe *)
                                 &(this_01->super_QAbstractEventDispatcherPrivate).field_0x94,
                                 (pollfd *)&local_48);
      if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                 super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 2) == 0) {
        iVar8 = QEventDispatcherUNIXPrivate::activateSocketNotifiers(this_01);
        iVar7 = iVar7 + iVar8;
      }
    }
  }
  if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
             super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) == 0) {
    iVar8 = QTimerInfoList::activateTimers(&this_01->timerList);
    iVar7 = iVar7 + iVar8;
  }
  uVar12 = (ulong)(0 < iVar7);
LAB_0037d81d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return SUB81(uVar12,0);
}

Assistant:

bool QEventDispatcherUNIX::processEvents(QEventLoop::ProcessEventsFlags flags)
{
    Q_D(QEventDispatcherUNIX);
    d->interrupt.storeRelaxed(0);

    // we are awake, broadcast it
    emit awake();

    auto threadData = d->threadData.loadRelaxed();
    QCoreApplicationPrivate::sendPostedEvents(nullptr, 0, threadData);

    const bool include_timers = (flags & QEventLoop::X11ExcludeTimers) == 0;
    const bool include_notifiers = (flags & QEventLoop::ExcludeSocketNotifiers) == 0;
    const bool wait_for_events = (flags & QEventLoop::WaitForMoreEvents) != 0;

    const bool canWait = (threadData->canWaitLocked()
                          && !d->interrupt.loadRelaxed()
                          && wait_for_events);

    if (canWait)
        emit aboutToBlock();

    if (d->interrupt.loadRelaxed())
        return false;

    QDeadlineTimer deadline;
    if (canWait) {
        if (include_timers) {
            std::optional<nanoseconds> remaining = d->timerList.timerWait();
            deadline = remaining ? QDeadlineTimer{*remaining}
                             : QDeadlineTimer(QDeadlineTimer::Forever);
        } else {
            deadline = QDeadlineTimer(QDeadlineTimer::Forever);
        }
    } else {
        // Using the default-constructed `deadline`, which is already expired,
        // ensures the code in the do-while loop in qt_safe_poll runs at least once.
    }

    d->pollfds.clear();
    d->pollfds.reserve(1 + (include_notifiers ? d->socketNotifiers.size() : 0));

    if (include_notifiers)
        for (auto it = d->socketNotifiers.cbegin(); it != d->socketNotifiers.cend(); ++it)
            d->pollfds.append(qt_make_pollfd(it.key(), it.value().events()));

    // This must be last, as it's popped off the end below
    d->pollfds.append(d->threadPipe.prepare());

    int nevents = 0;
    switch (qt_safe_poll(d->pollfds.data(), d->pollfds.size(), deadline)) {
    case -1:
        qErrnoWarning("qt_safe_poll");
        if (QT_CONFIG(poll_exit_on_error))
            abort();
        break;
    case 0:
        break;
    default:
        nevents += d->threadPipe.check(d->pollfds.takeLast());
        if (include_notifiers)
            nevents += d->activateSocketNotifiers();
        break;
    }

    if (include_timers)
        nevents += d->activateTimers();

    // return true if we handled events, false otherwise
    return (nevents > 0);
}